

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_whitelist_verify
              (secp256k1_context *ctx,secp256k1_whitelist_signature *sig,
              secp256k1_pubkey *online_pubkeys,secp256k1_pubkey *offline_pubkeys,size_t n_keys,
              secp256k1_pubkey *sub_pubkey)

{
  int iVar1;
  int local_9fd4;
  ulong uStack_9fd0;
  int overflow;
  size_t i;
  uchar msg32 [32];
  secp256k1_gej pubs [255];
  secp256k1_scalar s [255];
  secp256k1_pubkey *sub_pubkey_local;
  size_t n_keys_local;
  secp256k1_pubkey *offline_pubkeys_local;
  secp256k1_pubkey *online_pubkeys_local;
  secp256k1_whitelist_signature *sig_local;
  secp256k1_context *ctx_local;
  
  if (sig == (secp256k1_whitelist_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (online_pubkeys == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"online_pubkeys != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (offline_pubkeys == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"offline_pubkeys != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (sub_pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sub_pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else if ((sig->n_keys < 0x100) && (sig->n_keys == n_keys)) {
    for (uStack_9fd0 = 0; uStack_9fd0 < sig->n_keys; uStack_9fd0 = uStack_9fd0 + 1) {
      local_9fd4 = 0;
      secp256k1_scalar_set_b32
                ((secp256k1_scalar *)(s[uStack_9fd0 - 1].d + 3),
                 sig->data + uStack_9fd0 * 0x20 + 0x20,&local_9fd4);
      if ((local_9fd4 != 0) ||
         (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)(s[uStack_9fd0 - 1].d + 3)),
         iVar1 != 0)) {
        return 0;
      }
    }
    iVar1 = secp256k1_whitelist_compute_keys_and_message
                      (ctx,(uchar *)&i,(secp256k1_gej *)(msg32 + 0x18),online_pubkeys,
                       offline_pubkeys,(int)sig->n_keys,sub_pubkey);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ =
           secp256k1_borromean_verify
                     ((secp256k1_scalar *)0x0,sig->data,(secp256k1_scalar *)&pubs[0xfe].infinity,
                      (secp256k1_gej *)(msg32 + 0x18),&sig->n_keys,1,(uchar *)&i,0x20);
    }
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_whitelist_verify(const secp256k1_context* ctx, const secp256k1_whitelist_signature *sig, const secp256k1_pubkey *online_pubkeys, const secp256k1_pubkey *offline_pubkeys, const size_t n_keys, const secp256k1_pubkey *sub_pubkey) {
    secp256k1_scalar s[MAX_KEYS];
    secp256k1_gej pubs[MAX_KEYS];
    unsigned char msg32[32];
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(online_pubkeys != NULL);
    ARG_CHECK(offline_pubkeys != NULL);
    ARG_CHECK(sub_pubkey != NULL);

    if (sig->n_keys > MAX_KEYS || sig->n_keys != n_keys) {
        return 0;
    }
    for (i = 0; i < sig->n_keys; i++) {
        int overflow = 0;
        secp256k1_scalar_set_b32(&s[i], &sig->data[32 * (i + 1)], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&s[i])) {
            return 0;
        }
    }

    /* Compute pubkeys: online_pubkey + tweaked(offline_pubkey + address), and message */
    if (!secp256k1_whitelist_compute_keys_and_message(ctx, msg32, pubs, online_pubkeys, offline_pubkeys, sig->n_keys, sub_pubkey)) {
        return 0;
    }
    /* Do verification */
    return secp256k1_borromean_verify(NULL, &sig->data[0], s, pubs, &sig->n_keys, 1, msg32, 32);
}